

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

ly_set * lyd_find_path(lyd_node *ctx_node,char *path)

{
  int iVar1;
  lys_module *plVar2;
  char *pcVar3;
  ly_set *set;
  LY_ERR no;
  ly_ctx *ctx;
  ulong uVar4;
  long lVar5;
  undefined1 auStack_88 [8];
  lyxp_set xp_set;
  char *mod_name;
  char *name;
  int local_30;
  int mod_name_len;
  int name_len;
  int is_relative;
  
  mod_name_len = -1;
  if (ctx_node == (lyd_node *)0x0 || path == (char *)0x0) {
    pcVar3 = "Invalid arguments (%s()).";
    ctx = (ly_ctx *)0x0;
    no = LY_EINVAL;
  }
  else {
    iVar1 = parse_schema_nodeid(path,(char **)&xp_set.field_0x38,(int *)((long)&name + 4),&mod_name,
                                &local_30,&mod_name_len,(int *)0x0,(int *)0x0,1);
    if (((0 < iVar1) && (*mod_name == '#')) && (mod_name_len == 0)) {
      plVar2 = ctx_node->schema->module;
      if ((plVar2->field_0x40 & 1) != 0) {
        plVar2 = (lys_module *)plVar2->data;
      }
      pcVar3 = plVar2->name;
      iVar1 = strncmp((char *)xp_set._56_8_,pcVar3,(long)name._4_4_);
      if (iVar1 != 0) {
        return (ly_set *)0x0;
      }
      if (pcVar3[name._4_4_] != '\0') {
        return (ly_set *)0x0;
      }
      path = mod_name + local_30;
    }
    plVar2 = ctx_node->schema->module;
    if ((plVar2->field_0x40 & 1) != 0) {
      plVar2 = (lys_module *)plVar2->data;
    }
    pcVar3 = transform_json2xpath(plVar2,path);
    if (pcVar3 == (char *)0x0) {
      return (ly_set *)0x0;
    }
    xp_set.ht = (hash_table *)0x0;
    xp_set.ctx_pos = 0;
    xp_set.ctx_size = 0;
    xp_set.val._8_8_ = 0;
    xp_set.used = 0;
    xp_set.size = 0;
    xp_set._8_8_ = 0;
    xp_set.val.nodes = (lyxp_set_node *)0x0;
    auStack_88 = (undefined1  [8])0x0;
    xp_set.type = LYXP_SET_EMPTY;
    xp_set._4_4_ = 0;
    plVar2 = ctx_node->schema->module;
    if ((plVar2->field_0x40 & 1) != 0) {
      plVar2 = (lys_module *)plVar2->data;
    }
    iVar1 = lyxp_eval(pcVar3,ctx_node,LYXP_NODE_ELEM,plVar2,(lyxp_set *)auStack_88,0);
    free(pcVar3);
    if (iVar1 != 0) {
      return (ly_set *)0x0;
    }
    set = ly_set_new();
    if (set != (ly_set *)0x0) {
      if ((auStack_88._0_4_ == LYXP_SET_NODE_SET) && (xp_set.val._8_4_ != 0)) {
        lVar5 = 8;
        uVar4 = 0;
        do {
          if ((*(int *)(xp_set._8_8_ + lVar5) == 2) &&
             (iVar1 = ly_set_add(set,*(void **)(xp_set._8_8_ + -8 + lVar5),1), iVar1 < 0)) {
            free((set->set).s);
            free(set);
            set = (ly_set *)0x0;
            break;
          }
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 0x10;
        } while (uVar4 < (xp_set.val._8_8_ & 0xffffffff));
      }
      lyxp_set_cast((lyxp_set *)auStack_88,LYXP_SET_EMPTY,ctx_node,(lys_module *)0x0,0);
      return set;
    }
    ctx = ctx_node->schema->module->ctx;
    pcVar3 = "Memory allocation failed (%s()).";
    no = LY_EMEM;
  }
  ly_log(ctx,LY_LLERR,no,pcVar3,"lyd_find_path");
  return (ly_set *)0x0;
}

Assistant:

ly_set *
lyd_find_path(const struct lyd_node *ctx_node, const char *path)
{
    struct lyxp_set xp_set;
    struct ly_set *set;
    char *yang_xpath;
    const char * node_mod_name, *mod_name, *name;
    int mod_name_len, name_len, is_relative = -1;
    uint32_t i;

    if (!ctx_node || !path) {
        LOGARG;
        return NULL;
    }

    if (parse_schema_nodeid(path, &mod_name, &mod_name_len, &name, &name_len, &is_relative, NULL, NULL, 1) > 0) {
        if (name[0] == '#' && !is_relative) {
            node_mod_name = lyd_node_module(ctx_node)->name;
            if (strncmp(mod_name, node_mod_name, mod_name_len) || node_mod_name[mod_name_len]) {
                return NULL;
            }
            path = name + name_len;
        }
    }

    /* transform JSON into YANG XPATH */
    yang_xpath = transform_json2xpath(lyd_node_module(ctx_node), path);
    if (!yang_xpath) {
        return NULL;
    }

    memset(&xp_set, 0, sizeof xp_set);

    if (lyxp_eval(yang_xpath, ctx_node, LYXP_NODE_ELEM, lyd_node_module(ctx_node), &xp_set, 0) != EXIT_SUCCESS) {
        free(yang_xpath);
        return NULL;
    }
    free(yang_xpath);

    set = ly_set_new();
    LY_CHECK_ERR_RETURN(!set, LOGMEM(ctx_node->schema->module->ctx), NULL);

    if (xp_set.type == LYXP_SET_NODE_SET) {
        for (i = 0; i < xp_set.used; ++i) {
            if (xp_set.val.nodes[i].type == LYXP_NODE_ELEM) {
                if (ly_set_add(set, xp_set.val.nodes[i].node, LY_SET_OPT_USEASLIST) < 0) {
                    ly_set_free(set);
                    set = NULL;
                    break;
                }
            }
        }
    }
    /* free xp_set content */
    lyxp_set_cast(&xp_set, LYXP_SET_EMPTY, ctx_node, NULL, 0);

    return set;
}